

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PigLatinTranslator.cpp
# Opt level: O1

string * to_lower_case(string *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  byte *pbVar3;
  size_type sVar4;
  string *in_RDI;
  byte *pbVar5;
  
  pbVar3 = (byte *)(str->_M_dataplus)._M_p;
  if (str->_M_string_length == 0) {
    sVar4 = 0;
    pbVar5 = pbVar3;
  }
  else {
    do {
      if ((byte)(*pbVar3 + 0xbf) < 0x1a) {
        *pbVar3 = *pbVar3 | 0x20;
      }
      pbVar3 = pbVar3 + 1;
      pbVar5 = (byte *)(str->_M_dataplus)._M_p;
      sVar4 = str->_M_string_length;
    } while (pbVar3 != pbVar5 + sVar4);
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  paVar1 = &str->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pbVar5 == paVar1) {
    uVar2 = *(undefined8 *)((long)&str->field_2 + 8);
    (in_RDI->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uVar2;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)pbVar5;
    (in_RDI->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  in_RDI->_M_string_length = sVar4;
  (str->_M_dataplus)._M_p = (pointer)paVar1;
  str->_M_string_length = 0;
  (str->field_2)._M_local_buf[0] = '\0';
  return in_RDI;
}

Assistant:

std::string to_lower_case(std::string str) {
  for(std::string::iterator letter = str.begin(); letter != str.end(); letter++) {
    if(is_upper_case(*letter)) {
      *letter = to_lower_case(*letter);
    }
  }
  return str;
}